

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotShadedEx<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>>
               (char *label_id,GetterXsYs<int> *getter1,GetterXsYRef<int> *getter2,bool fit2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  int *piVar10;
  ImPlotPlot *pIVar11;
  ImPlotRange *pIVar12;
  ImPlotContext *pIVar13;
  bool bVar14;
  ImU32 col;
  long lVar15;
  ImDrawList *DrawList;
  undefined7 in_register_00000009;
  uint uVar16;
  byte bVar17;
  int iVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  byte local_8c;
  byte local_88;
  TransformerLinLin local_84;
  GetterXsYRef<int> *local_80;
  GetterXsYs<int> *local_78;
  undefined8 local_70;
  undefined4 local_64;
  ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLinLin>
  local_60;
  
  bVar14 = BeginItem(label_id,1);
  pIVar13 = GImPlot;
  if (bVar14) {
    if (GImPlot->FitThisFrame == true) {
      local_64 = (undefined4)CONCAT71(in_register_00000009,fit2);
      iVar1 = getter1->Count;
      if (0 < iVar1) {
        piVar9 = getter1->Xs;
        piVar10 = getter1->Ys;
        iVar2 = getter1->Offset;
        iVar3 = getter1->Stride;
        pIVar11 = GImPlot->CurrentPlot;
        iVar4 = pIVar11->CurrentYAxis;
        uVar5 = (pIVar11->XAxis).Flags;
        pIVar12 = GImPlot->ExtentsY;
        uVar6 = pIVar11->YAxis[iVar4].Flags;
        iVar18 = 0;
        uVar16 = uVar6 & 0x20;
        local_70 = (double)(CONCAT44(local_70._4_4_,uVar5) & 0xffffffff00000020);
        do {
          lVar15 = (long)(((iVar2 + iVar18) % iVar1 + iVar1) % iVar1) * (long)iVar3;
          iVar7 = *(int *)((long)piVar9 + lVar15);
          dVar20 = (double)iVar7;
          iVar8 = *(int *)((long)piVar10 + lVar15);
          dVar19 = (double)iVar8;
          if ((uVar5 >> 10 & 1) == 0) {
            if ((0 < iVar7) || ((int)local_70 == 0)) {
LAB_001edf6c:
              dVar21 = (pIVar13->ExtentsX).Min;
              dVar22 = dVar20;
              if (dVar21 <= dVar20) {
                dVar22 = dVar21;
              }
              (pIVar13->ExtentsX).Min = dVar22;
              dVar21 = (pIVar13->ExtentsX).Max;
              dVar22 = dVar20;
              if (dVar20 <= dVar21) {
                dVar22 = dVar21;
              }
              (pIVar13->ExtentsX).Max = dVar22;
            }
          }
          else if (((pIVar11->YAxis[iVar4].Range.Min <= dVar19) &&
                   (dVar19 <= pIVar11->YAxis[iVar4].Range.Max)) &&
                  (local_8c = (byte)((uVar5 & 0x20) >> 5), (iVar7 < 1 & local_8c) == 0))
          goto LAB_001edf6c;
          if ((uVar6 >> 10 & 1) == 0) {
            if ((0 < iVar8) || (uVar16 == 0)) {
LAB_001edfc8:
              dVar20 = pIVar12[iVar4].Min;
              dVar21 = dVar19;
              if (dVar20 <= dVar19) {
                dVar21 = dVar20;
              }
              pIVar12[iVar4].Min = dVar21;
              dVar20 = pIVar13->ExtentsY[iVar4].Max;
              if (dVar19 <= dVar20) {
                dVar19 = dVar20;
              }
              pIVar13->ExtentsY[iVar4].Max = dVar19;
            }
          }
          else if ((((pIVar11->XAxis).Range.Min <= dVar20) && (dVar20 <= (pIVar11->XAxis).Range.Max)
                   ) && (local_88 = (byte)(uVar16 >> 5), (iVar8 < 1 & local_88) == 0))
          goto LAB_001edfc8;
          iVar18 = iVar18 + 1;
        } while (iVar1 != iVar18);
      }
      if ((fit2) && (iVar1 = getter2->Count, 0 < iVar1)) {
        piVar9 = getter2->Xs;
        iVar2 = getter2->Offset;
        iVar3 = getter2->Stride;
        dVar19 = getter2->YRef;
        pIVar11 = pIVar13->CurrentPlot;
        iVar4 = pIVar11->CurrentYAxis;
        uVar5 = (pIVar11->XAxis).Flags;
        uVar6 = pIVar11->YAxis[iVar4].Flags;
        local_70 = ABS(dVar19);
        bVar17 = dVar19 <= 0.0 & (byte)((uVar6 & 0x20) >> 5);
        iVar18 = 0;
        uVar16 = uVar5 & 0x20;
        do {
          iVar7 = *(int *)((long)piVar9 +
                          (long)(((iVar2 + iVar18) % iVar1 + iVar1) % iVar1) * (long)iVar3);
          dVar20 = (double)iVar7;
          if ((uVar5 >> 10 & 1) == 0) {
            if ((0 < iVar7) || (uVar16 == 0)) {
LAB_001ee0f1:
              dVar21 = (pIVar13->ExtentsX).Min;
              dVar22 = dVar20;
              if (dVar21 <= dVar20) {
                dVar22 = dVar21;
              }
              (pIVar13->ExtentsX).Min = dVar22;
              dVar21 = (pIVar13->ExtentsX).Max;
              dVar22 = dVar20;
              if (dVar20 <= dVar21) {
                dVar22 = dVar21;
              }
              (pIVar13->ExtentsX).Max = dVar22;
            }
          }
          else if (((pIVar11->YAxis[iVar4].Range.Min <= dVar19) &&
                   (dVar19 <= pIVar11->YAxis[iVar4].Range.Max)) &&
                  (local_8c = (byte)(uVar16 >> 5), (iVar7 < 1 & local_8c) == 0)) goto LAB_001ee0f1;
          if ((uVar6 >> 10 & 1) == 0) {
            if ((ulong)local_70 < 0x7ff0000000000000 && bVar17 == 0) {
LAB_001ee129:
              dVar20 = pIVar13->ExtentsY[iVar4].Min;
              dVar21 = dVar19;
              if (dVar20 <= dVar19) {
                dVar21 = dVar20;
              }
              pIVar13->ExtentsY[iVar4].Min = dVar21;
              dVar20 = pIVar13->ExtentsY[iVar4].Max;
              dVar21 = dVar19;
              if (dVar19 <= dVar20) {
                dVar21 = dVar20;
              }
              pIVar13->ExtentsY[iVar4].Max = dVar21;
            }
          }
          else if (((ulong)local_70 < 0x7ff0000000000000 && bVar17 == 0) &&
                   ((pIVar11->XAxis).Range.Min <= dVar20 && dVar20 <= (pIVar11->XAxis).Range.Max))
          goto LAB_001ee129;
          iVar18 = iVar18 + 1;
        } while (iVar1 != iVar18);
      }
    }
    local_80 = getter2;
    local_78 = getter1;
    DrawList = GetPlotDrawList();
    if ((pIVar13->NextItemData).RenderFill == true) {
      col = ImGui::GetColorU32((pIVar13->NextItemData).Colors + 1);
      switch(GImPlot->Scales[GImPlot->CurrentPlot->CurrentYAxis]) {
      case 0:
        local_84.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLinLin>
        ::ShadedRenderer(&local_60,local_78,local_80,&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLinLin>>
                  (&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        local_84.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLin>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLin>
                          *)&local_60,local_78,local_80,(TransformerLogLin *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLogLin>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLin>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        local_84.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLinLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLinLog>
                          *)&local_60,local_78,local_80,(TransformerLinLog *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLinLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLinLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        local_84.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
        ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLog>
                          *)&local_60,local_78,local_80,(TransformerLogLog *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLogLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    pIVar13 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar13->NextItemData);
    pIVar13->PreviousItem = pIVar13->CurrentItem;
    pIVar13->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2, bool fit2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter1.Count; ++i)
                FitPoint(getter1(i));
            if (fit2) {
                for (int i = 0; i < getter2.Count; ++i)
                    FitPoint(getter2(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}